

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipasir.cc
# Opt level: O0

void __thiscall IPAsirMiniSAT::add(IPAsirMiniSAT *this,int lit)

{
  int in_ESI;
  IPAsirMiniSAT *in_RDI;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  IPAsirMiniSAT *in_stack_ffffffffffffffe0;
  vec<Minisat::Lit> *this_00;
  
  reset(in_stack_ffffffffffffffe0);
  in_RDI->nomodel = true;
  if (in_ESI == 0) {
    Minisat::SimpSolver::addClause
              (&in_stack_ffffffffffffffe0->super_SimpSolver,
               (vec<Minisat::Lit> *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
    Minisat::vec<Minisat::Lit>::clear
              ((vec<Minisat::Lit> *)in_stack_ffffffffffffffe0,(bool)in_stack_ffffffffffffffdf);
  }
  else {
    this_00 = &in_RDI->clause;
    import(in_RDI,(int)((ulong)this_00 >> 0x20));
    Minisat::vec<Minisat::Lit>::push
              (this_00,(Lit *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  }
  return;
}

Assistant:

void add(int lit)
    {
        reset();
        nomodel = true;
        if (lit)
            clause.push(import(lit));
        else
            addClause(clause), clause.clear();
    }